

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O1

int __thiscall NetOptimize::fuse_convolutiondepthwise_activation(NetOptimize *this)

{
  Mat *pMVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  int *piVar4;
  pointer ppLVar5;
  void *pvVar6;
  long *plVar7;
  undefined4 *puVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  string *psVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  Layer *pLVar17;
  Mat local_98;
  Layer *local_48;
  string *local_40;
  long local_38;
  
  pvVar2 = (this->super_ModelWriter).layers;
  lVar11 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar11 != 0) {
    uVar12 = lVar11 >> 3;
    lVar11 = uVar12 + (uVar12 == 0);
    lVar14 = 0;
    local_38 = lVar11;
    do {
      iVar9 = std::__cxx11::string::compare
                        ((char *)&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar14]->type);
      if (iVar9 == 0) {
        uVar15 = lVar14 + 1;
        uVar16 = uVar15;
        if (uVar15 < uVar12) {
          iVar9 = *((((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar14]->tops).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          do {
            iVar10 = std::__cxx11::string::compare
                               ((char *)&(((this->super_ModelWriter).layers)->
                                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar15]->type);
            if (((((iVar10 == 0) ||
                  (iVar10 = std::__cxx11::string::compare
                                      ((char *)&(((this->super_ModelWriter).layers)->
                                                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                                )._M_impl.super__Vector_impl_data._M_start[uVar15]->
                                                type), iVar10 == 0)) ||
                 (iVar10 = std::__cxx11::string::compare
                                     ((char *)&(((this->super_ModelWriter).layers)->
                                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start[uVar15]->
                                               type), iVar10 == 0)) ||
                ((iVar10 = std::__cxx11::string::compare
                                     ((char *)&(((this->super_ModelWriter).layers)->
                                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start[uVar15]->
                                               type), iVar10 == 0 ||
                 (iVar10 = std::__cxx11::string::compare
                                     ((char *)&(((this->super_ModelWriter).layers)->
                                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start[uVar15]->
                                               type), iVar10 == 0)))) &&
               ((pLVar3 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar15],
                piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                (long)(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar4 == 4 &&
                (lVar11 = local_38, uVar16 = uVar15, *piVar4 == iVar9)))) break;
            uVar15 = uVar15 + 1;
            lVar11 = local_38;
            uVar16 = uVar12;
          } while (uVar15 < uVar12);
        }
        if (uVar16 != uVar12) {
          ppLVar5 = (((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pLVar3 = ppLVar5[lVar14];
          pLVar17 = ppLVar5[uVar16];
          fprintf(_stderr,"fuse_convolutiondepthwise_activation %s %s\n",
                  (pLVar3->name)._M_dataplus._M_p);
          local_40 = &pLVar17->type;
          iVar9 = std::__cxx11::string::compare((char *)local_40);
          psVar13 = local_40;
          if (iVar9 == 0) {
            if ((*(float *)&pLVar17[1]._vptr_Layer != 0.0) ||
               (NAN(*(float *)&pLVar17[1]._vptr_Layer))) {
              *(undefined4 *)&pLVar3[1].type.field_2 = 2;
              local_98.cstep = 0;
              local_98.data = (void *)0x0;
              local_98.refcount._0_4_ = 0;
              local_98.refcount._4_4_ = 0;
              local_98.elemsize._0_4_ = 0;
              local_98.elemsize._4_4_ = 0;
              local_98.elempack = 0;
              local_98.h = 0;
              local_98.d = 0;
              local_98.c = 0;
              local_98.allocator = (Allocator *)0x0;
              local_98.dims = 0;
              local_98.w = 0;
              local_48 = pLVar17;
              ncnn::Mat::create(&local_98,1,4,(Allocator *)0x0);
              pMVar1 = (Mat *)((long)&pLVar3[1].type.field_2 + 8);
              if (pMVar1 != &local_98) {
                piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
                if (piVar4 != (int *)0x0) {
                  LOCK();
                  *piVar4 = *piVar4 + 1;
                  UNLOCK();
                }
                piVar4 = (int *)pLVar3[1].name._M_dataplus._M_p;
                if (piVar4 != (int *)0x0) {
                  LOCK();
                  *piVar4 = *piVar4 + -1;
                  UNLOCK();
                  if (*piVar4 == 0) {
                    pvVar6 = *(void **)((long)&pLVar3[1].type.field_2 + 8);
                    plVar7 = *(long **)((long)&pLVar3[1].name.field_2 + 8);
                    if (plVar7 == (long *)0x0) {
                      if (pvVar6 != (void *)0x0) {
                        free(pvVar6);
                      }
                    }
                    else {
                      (**(code **)(*plVar7 + 0x18))();
                    }
                  }
                }
                pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = 0;
                *(undefined8 *)((long)&pLVar3[1].name._M_dataplus._M_p + 4) = 0;
                *(undefined8 *)((long)&pLVar3[1].name._M_string_length + 4) = 0;
                pMVar1->data = (void *)0x0;
                pLVar3[1].name._M_dataplus._M_p = (pointer)0x0;
                pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = 0;
                pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                *(undefined4 *)
                 &pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = 0;
                *(void **)((long)&pLVar3[1].type.field_2 + 8) = local_98.data;
                pLVar3[1].name._M_dataplus._M_p =
                     (pointer)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
                pLVar3[1].name._M_string_length =
                     CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
                *(int *)&pLVar3[1].name.field_2 = local_98.elempack;
                *(Allocator **)((long)&pLVar3[1].name.field_2 + 8) = local_98.allocator;
                *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data = local_98.dims;
                *(int *)((long)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start + 4) = local_98.w;
                *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish = local_98.h;
                *(int *)((long)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 4) = local_98.d;
                *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage = local_98.c;
                *(size_t *)
                 &pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data = local_98.cstep;
              }
              pLVar17 = local_48;
              piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (local_98.allocator == (Allocator *)0x0) {
                    if (local_98.data != (void *)0x0) {
                      free(local_98.data);
                    }
                  }
                  else {
                    (*(local_98.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              *(undefined4 *)pMVar1->data = *(undefined4 *)&pLVar17[1]._vptr_Layer;
              goto LAB_00168468;
            }
            *(undefined4 *)&pLVar3[1].type.field_2 = 1;
          }
          else {
            local_48 = pLVar17;
            iVar9 = std::__cxx11::string::compare((char *)local_40);
            if (iVar9 == 0) {
              *(undefined4 *)&pLVar3[1].type.field_2 = 3;
              local_98.cstep = 0;
              local_98.data = (void *)0x0;
              local_98.refcount._0_4_ = 0;
              local_98.refcount._4_4_ = 0;
              local_98.elemsize._0_4_ = 0;
              local_98.elemsize._4_4_ = 0;
              local_98.elempack = 0;
              local_98.h = 0;
              local_98.d = 0;
              local_98.c = 0;
              local_98.allocator = (Allocator *)0x0;
              local_98.dims = 0;
              local_98.w = 0;
              ncnn::Mat::create(&local_98,2,4,(Allocator *)0x0);
              pLVar17 = local_48;
              pMVar1 = (Mat *)((long)&pLVar3[1].type.field_2 + 8);
              if (pMVar1 != &local_98) {
                piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
                if (piVar4 != (int *)0x0) {
                  LOCK();
                  *piVar4 = *piVar4 + 1;
                  UNLOCK();
                }
                piVar4 = (int *)pLVar3[1].name._M_dataplus._M_p;
                if (piVar4 != (int *)0x0) {
                  LOCK();
                  *piVar4 = *piVar4 + -1;
                  UNLOCK();
                  if (*piVar4 == 0) {
                    pvVar6 = *(void **)((long)&pLVar3[1].type.field_2 + 8);
                    plVar7 = *(long **)((long)&pLVar3[1].name.field_2 + 8);
                    if (plVar7 == (long *)0x0) {
                      if (pvVar6 != (void *)0x0) {
                        free(pvVar6);
                      }
                    }
                    else {
                      (**(code **)(*plVar7 + 0x18))();
                    }
                  }
                }
                pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = 0;
                *(undefined8 *)((long)&pLVar3[1].name._M_dataplus._M_p + 4) = 0;
                *(undefined8 *)((long)&pLVar3[1].name._M_string_length + 4) = 0;
                pMVar1->data = (void *)0x0;
                pLVar3[1].name._M_dataplus._M_p = (pointer)0x0;
                pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = 0;
                pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                *(undefined4 *)
                 &pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = 0;
                *(void **)((long)&pLVar3[1].type.field_2 + 8) = local_98.data;
                pLVar3[1].name._M_dataplus._M_p =
                     (pointer)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
                pLVar3[1].name._M_string_length =
                     CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
                *(int *)&pLVar3[1].name.field_2 = local_98.elempack;
                *(Allocator **)((long)&pLVar3[1].name.field_2 + 8) = local_98.allocator;
                *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data = local_98.dims;
                *(int *)((long)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start + 4) = local_98.w;
                *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish = local_98.h;
                *(int *)((long)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 4) = local_98.d;
                *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage = local_98.c;
                *(size_t *)
                 &pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data = local_98.cstep;
              }
              piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (local_98.allocator == (Allocator *)0x0) {
LAB_00168409:
                    if (local_98.data != (void *)0x0) {
                      free(local_98.data);
                    }
                  }
                  else {
                    (*(local_98.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
LAB_00168424:
              puVar8 = *(undefined4 **)((long)&pLVar3[1].type.field_2 + 8);
              *puVar8 = *(undefined4 *)&pLVar17[1]._vptr_Layer;
              puVar8[1] = *(undefined4 *)((long)&pLVar17[1]._vptr_Layer + 4);
LAB_00168468:
              local_98.cstep = 0;
              local_98.c = 0;
              local_98.d = 0;
              local_98.h = 0;
              local_98.w = 0;
              local_98.dims = 0;
              local_98.elempack = 0;
              local_98.elemsize._4_4_ = 0;
              local_98.elemsize._0_4_ = 0;
              local_98.refcount._4_4_ = 0;
              local_98.refcount._0_4_ = 0;
              local_98.data = (void *)0x0;
              psVar13 = local_40;
            }
            else {
              iVar9 = std::__cxx11::string::compare((char *)psVar13);
              if (iVar9 == 0) {
                *(undefined4 *)&pLVar3[1].type.field_2 = 4;
                pLVar17 = local_48;
              }
              else {
                iVar9 = std::__cxx11::string::compare((char *)psVar13);
                if (iVar9 == 0) {
                  *(undefined4 *)&pLVar3[1].type.field_2 = 5;
                  pLVar17 = local_48;
                }
                else {
                  iVar9 = std::__cxx11::string::compare((char *)psVar13);
                  pLVar17 = local_48;
                  if (iVar9 == 0) {
                    *(undefined4 *)&pLVar3[1].type.field_2 = 6;
                    local_98.cstep = 0;
                    local_98.data = (void *)0x0;
                    local_98.refcount._0_4_ = 0;
                    local_98.refcount._4_4_ = 0;
                    local_98.elemsize._0_4_ = 0;
                    local_98.elemsize._4_4_ = 0;
                    local_98.elempack = 0;
                    local_98.h = 0;
                    local_98.d = 0;
                    local_98.c = 0;
                    local_98.allocator = (Allocator *)0x0;
                    local_98.dims = 0;
                    local_98.w = 0;
                    ncnn::Mat::create(&local_98,2,4,(Allocator *)0x0);
                    pMVar1 = (Mat *)((long)&pLVar3[1].type.field_2 + 8);
                    if (pMVar1 != &local_98) {
                      piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
                      if (piVar4 != (int *)0x0) {
                        LOCK();
                        *piVar4 = *piVar4 + 1;
                        UNLOCK();
                      }
                      piVar4 = (int *)pLVar3[1].name._M_dataplus._M_p;
                      if (piVar4 != (int *)0x0) {
                        LOCK();
                        *piVar4 = *piVar4 + -1;
                        UNLOCK();
                        if (*piVar4 == 0) {
                          pvVar6 = *(void **)((long)&pLVar3[1].type.field_2 + 8);
                          plVar7 = *(long **)((long)&pLVar3[1].name.field_2 + 8);
                          if (plVar7 == (long *)0x0) {
                            if (pvVar6 != (void *)0x0) {
                              free(pvVar6);
                            }
                          }
                          else {
                            (**(code **)(*plVar7 + 0x18))();
                          }
                        }
                      }
                      pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start = 0;
                      *(undefined8 *)((long)&pLVar3[1].name._M_dataplus._M_p + 4) = 0;
                      *(undefined8 *)((long)&pLVar3[1].name._M_string_length + 4) = 0;
                      pMVar1->data = (void *)0x0;
                      pLVar3[1].name._M_dataplus._M_p = (pointer)0x0;
                      pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start = 0;
                      pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish = (pointer)0x0;
                      *(undefined4 *)
                       &pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage = 0;
                      *(void **)((long)&pLVar3[1].type.field_2 + 8) = local_98.data;
                      pLVar3[1].name._M_dataplus._M_p =
                           (pointer)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
                      pLVar3[1].name._M_string_length =
                           CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
                      *(int *)&pLVar3[1].name.field_2 = local_98.elempack;
                      *(Allocator **)((long)&pLVar3[1].name.field_2 + 8) = local_98.allocator;
                      *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data = local_98.dims;
                      *(int *)((long)&pLVar3[1].bottoms.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start + 4) = local_98.w;
                      *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish = local_98.h;
                      *(int *)((long)&pLVar3[1].bottoms.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish + 4) = local_98.d;
                      *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage = local_98.c;
                      *(size_t *)
                       &pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data = local_98.cstep;
                    }
                    pLVar17 = local_48;
                    piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
                    if (piVar4 != (int *)0x0) {
                      LOCK();
                      *piVar4 = *piVar4 + -1;
                      UNLOCK();
                      if (*piVar4 == 0) {
                        if (local_98.allocator == (Allocator *)0x0) goto LAB_00168409;
                        (*(local_98.allocator)->_vptr_Allocator[3])();
                      }
                    }
                    goto LAB_00168424;
                  }
                }
              }
            }
          }
          iVar9 = *(pLVar17->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start = iVar9;
          (((this->super_ModelWriter).blobs)->
          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
          super__Vector_impl_data._M_start[iVar9].producer = (int)lVar14;
          std::__cxx11::string::_M_replace
                    ((ulong)psVar13,0,(char *)(pLVar17->type)._M_string_length,0x55a19a);
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar11);
  }
  return 0;
}

Assistant:

int NetOptimize::fuse_convolutiondepthwise_activation()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "ConvolutionDepthWise")
            continue;

        // ConvolutionDepthWise - Activation
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "ReLU" && layers[j]->type != "Clip" && layers[j]->type != "Sigmoid" && layers[j]->type != "Mish" && layers[j]->type != "HardSwish")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse ConvolutionDepthWise - Activation to ConvolutionDepthWise
        ncnn::ConvolutionDepthWise* convolutiondepthwise = (ncnn::ConvolutionDepthWise*)layers[i];
        ncnn::Layer* activation = layers[j];

        fprintf(stderr, "fuse_convolutiondepthwise_activation %s %s\n", convolutiondepthwise->name.c_str(), activation->name.c_str());

        if (activation->type == "ReLU")
        {
            ncnn::ReLU* relu = (ncnn::ReLU*)activation;

            if (relu->slope == 0.f)
            {
                convolutiondepthwise->activation_type = 1;
            }
            else
            {
                convolutiondepthwise->activation_type = 2;
                convolutiondepthwise->activation_params = ncnn::Mat(1);
                convolutiondepthwise->activation_params[0] = relu->slope;
            }
        }
        else if (activation->type == "Clip")
        {
            ncnn::Clip* clip = (ncnn::Clip*)activation;

            convolutiondepthwise->activation_type = 3;
            convolutiondepthwise->activation_params = ncnn::Mat(2);
            convolutiondepthwise->activation_params[0] = clip->min;
            convolutiondepthwise->activation_params[1] = clip->max;
        }
        else if (activation->type == "Sigmoid")
        {
            convolutiondepthwise->activation_type = 4;
        }
        else if (activation->type == "Mish")
        {
            convolutiondepthwise->activation_type = 5;
        }
        else if (activation->type == "HardSwish")
        {
            ncnn::HardSwish* hardswish = (ncnn::HardSwish*)activation;

            convolutiondepthwise->activation_type = 6;
            convolutiondepthwise->activation_params = ncnn::Mat(2);
            convolutiondepthwise->activation_params[0] = hardswish->alpha;
            convolutiondepthwise->activation_params[1] = hardswish->beta;
        }

        int top_blob_index_final = activation->tops[0];
        convolutiondepthwise->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        activation->type = "ncnnfused";
    }

    return 0;
}